

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall
cmGraphVizWriter::GenerateForTargetType(cmGraphVizWriter *this,TargetType targetType)

{
  TargetType targetType_local;
  cmGraphVizWriter *this_local;
  
  switch(targetType) {
  case EXECUTABLE:
    this_local._7_1_ = (bool)(this->GenerateForExecutables & 1);
    break;
  case STATIC_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForStaticLibs & 1);
    break;
  case SHARED_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForSharedLibs & 1);
    break;
  case MODULE_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForModuleLibs & 1);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGraphVizWriter::GenerateForTargetType(cmTarget::TargetType targetType)
                                                                          const
{
  switch (targetType)
  {
    case cmTarget::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmTarget::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmTarget::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmTarget::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    default:
      break;
  }
  return false;
}